

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalTexture1DShadowProjOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  
  fVar1 = c->in[0].m_data[3];
  fVar1 = texture1DShadowOffset
                    (c,c->in[0].m_data[2] / fVar1,c->in[0].m_data[0] / fVar1,p->lod,
                     (p->offset).m_data[0]);
  (c->color).m_data[0] = fVar1;
  return;
}

Assistant:

static void		evalTexture1DShadowProjOffset		(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture1DShadowOffset(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), p.lod, p.offset.x()); }